

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_array_defs.h
# Opt level: O1

void __thiscall
ON_SimpleArray<ON__CNewMeshFace>::Append(ON_SimpleArray<ON__CNewMeshFace> *this,ON__CNewMeshFace *x)

{
  float *pfVar1;
  int iVar2;
  ON__CNewMeshFace *pOVar3;
  undefined8 uVar4;
  undefined8 uVar5;
  ON_2fPoint OVar6;
  ON_2fPoint OVar7;
  bool bVar8;
  bool bVar9;
  bool bVar10;
  bool bVar11;
  float fVar12;
  int iVar13;
  ON__CNewMeshFace *memblock;
  int iVar14;
  uint uVar15;
  
  iVar2 = this->m_count;
  memblock = x;
  if (iVar2 == this->m_capacity) {
    if ((iVar2 < 8) || ((ulong)((long)iVar2 * 0x2c) < 0x10000001)) {
      uVar15 = 4;
      if (2 < iVar2) {
        uVar15 = iVar2 * 2;
      }
    }
    else {
      iVar14 = 0x5d174d;
      if (iVar2 < 0x5d174d) {
        iVar14 = iVar2;
      }
      uVar15 = iVar14 + iVar2;
    }
    if (x < this->m_a + this->m_capacity && this->m_a <= x) {
      memblock = (ON__CNewMeshFace *)onmalloc(0x2c);
      iVar2 = x->newvcnt;
      bVar8 = x->bNewV[0];
      bVar9 = x->bNewV[1];
      bVar10 = x->bNewV[2];
      bVar11 = x->bNewV[3];
      fVar12 = x->tc[0].x;
      uVar4 = *(undefined8 *)&x->tc[0].y;
      uVar5 = *(undefined8 *)&x->tc[1].y;
      OVar6 = x->tc[2];
      OVar7 = x->tc[3];
      memblock->fi = x->fi;
      memblock->newvcnt = iVar2;
      memblock->bNewV[0] = bVar8;
      memblock->bNewV[1] = bVar9;
      memblock->bNewV[2] = bVar10;
      memblock->bNewV[3] = bVar11;
      memblock->tc[0].x = fVar12;
      *(undefined8 *)&memblock->tc[0].y = uVar4;
      *(undefined8 *)&memblock->tc[1].y = uVar5;
      memblock->tc[2] = OVar6;
      memblock->tc[3] = OVar7;
    }
    if ((uint)this->m_capacity < uVar15) {
      SetCapacity(this,(long)(int)uVar15);
    }
    if (this->m_a == (ON__CNewMeshFace *)0x0) {
      ON_ErrorEx("/workspace/llm4binary/github/license_c_cmakelists/mcneel[P]opennurbs/opennurbs_array_defs.h"
                 ,0x1f0,"","allocation failure");
      return;
    }
  }
  pOVar3 = this->m_a;
  iVar2 = this->m_count;
  this->m_count = iVar2 + 1;
  iVar14 = memblock->fi;
  iVar13 = memblock->newvcnt;
  bVar8 = memblock->bNewV[0];
  bVar9 = memblock->bNewV[1];
  bVar10 = memblock->bNewV[2];
  bVar11 = memblock->bNewV[3];
  fVar12 = memblock->tc[0].x;
  uVar4 = *(undefined8 *)&memblock->tc[0].y;
  uVar5 = *(undefined8 *)&memblock->tc[1].y;
  OVar6 = memblock->tc[3];
  pOVar3[iVar2].tc[2] = memblock->tc[2];
  (pOVar3[iVar2].tc + 2)[1] = OVar6;
  pfVar1 = &pOVar3[iVar2].tc[0].y;
  *(undefined8 *)pfVar1 = uVar4;
  *(undefined8 *)(pfVar1 + 2) = uVar5;
  pOVar3 = pOVar3 + iVar2;
  pOVar3->fi = iVar14;
  pOVar3->newvcnt = iVar13;
  pOVar3->bNewV[0] = bVar8;
  pOVar3->bNewV[1] = bVar9;
  pOVar3->bNewV[2] = bVar10;
  pOVar3->bNewV[3] = bVar11;
  pOVar3->tc[0].x = fVar12;
  if (memblock != x) {
    onfree(memblock);
    return;
  }
  return;
}

Assistant:

void ON_SimpleArray<T>::Append( const T& x ) 
{
  const T* p = &x;
  if ( m_count == m_capacity ) 
  {
    const int newcapacity = NewCapacity();
    if ( p >= m_a && p < (m_a + m_capacity) )
    {
      // 26 Sep 2005 Dale Lear
      // x is in the block of memory about to be reallocated.
      void* temp = onmalloc(sizeof(T));
      memcpy(temp, (void*)p, sizeof(T));
      p = (T*)temp;
    }
    Reserve(newcapacity);
    if (nullptr == m_a)
    {
      ON_ERROR("allocation failure");
      return;
    }
  }
  m_a[m_count++] = *p;
  if (p != &x)
    onfree((void*)p);
}